

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfs-seq.c
# Opt level: O1

int main(int argc,char **argv)

{
  __time_t _Var1;
  uint d;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  timespec tv;
  timespec local_38;
  
  lVar5 = (long)_optind;
  if (_optind + 3 < argc) {
    d = atoi(argv[lVar5]);
    uVar2 = atoi(argv[lVar5 + 1]);
    w = uVar2;
    uVar3 = atoi(argv[lVar5 + 2]);
    n = uVar3;
    uVar4 = atoi(argv[lVar5 + 3]);
    printf("Running depth first search on %d balanced trees with depth %d, width %d, grain %d.\n",
           (ulong)uVar4,(ulong)d,(ulong)uVar2,(ulong)uVar3);
    clock_gettime(1,&local_38);
    lVar5 = local_38.tv_nsec;
    _Var1 = local_38.tv_sec;
    if (0 < (int)uVar4) {
      tree(d);
    }
    clock_gettime(1,&local_38);
    printf("Time: %f\n",
           ((double)local_38.tv_nsec * 1e-09 + (double)local_38.tv_sec) -
           ((double)lVar5 * 1e-09 + (double)_Var1));
    return 0;
  }
  main_cold_1();
  halt_baddata();
}

Assistant:

int main(int argc, char **argv)
{
    if (optind + 3 >= argc) {
        usage(argv[0]);
        exit(1);
    }

    int d, m;

    d = atoi(argv[optind]);
    w = atoi(argv[optind+1]);
    n = atoi(argv[optind+2]);
    m = atoi(argv[optind+3]);

    printf("Running depth first search on %d balanced trees with depth %d, width %d, grain %d.\n", m, d, w, n);

    double t1 = wctime();
    int i;
    for(i=0; i<m; i++) tree(d);
    double t2 = wctime();

    printf("Time: %f\n", t2-t1);

    return 0;
}